

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

void __thiscall
ddd::DaTrie<false,_true,_true>::delete_prefix_leaf(DaTrie<false,_true,_true> *this,Query *query)

{
  byte bVar1;
  byte bVar2;
  uint node_pos;
  pointer pBVar3;
  Bc BVar4;
  pointer pNVar5;
  ulong uVar6;
  ulong uVar7;
  
  node_pos = query->node_pos_;
  pBVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (ulong)*(uint *)&pBVar3[node_pos].field_0x4 & 0x7fffffff;
  BVar4 = pBVar3[uVar7];
  uVar6 = (ulong)BVar4 & 0x7fffffff;
  if (uVar6 == 0x7fffffff || BVar4._0_4_ < 0) {
    delete_sib_(this,node_pos);
    unfix_(this,query->node_pos_,&this->blocks_);
    return;
  }
  pNVar5 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
           _M_impl.super__Vector_impl_data._M_start;
  bVar1 = pNVar5[uVar7].child;
  bVar2 = pNVar5[(uint)uVar6 ^ (uint)bVar1].sib;
  delete_sib_(this,node_pos);
  unfix_(this,query->node_pos_,&this->blocks_);
  if (bVar2 == bVar1) {
    *(undefined4 *)
     ((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
      super__Vector_impl_data._M_start + uVar7) = 0x7fffffff;
  }
  return;
}

Assistant:

void delete_prefix_leaf(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_leaf());
    assert(Prefix);

    auto parent_pos = bc_[query.node_pos()].check();
    auto edge_size = edge_size_(parent_pos, 2);
    assert(edge_size != 0);

    if (WithNLM) {
      delete_sib_(query.node_pos());
    }

    unfix_(query.node_pos(), blocks_);
    if (edge_size == 1) {
      bc_[parent_pos].set_base(INVALID_VALUE);
    }
  }